

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O2

void __thiscall Refal2::CLeftPartCompiler::matchLeftParens(CLeftPartCompiler *this)

{
  CNodeType *toNode;
  CNodeType *fromNode;
  CNodeType *nodeAfter;
  CHoleNode *this_00;
  CUnitList newHole;
  CNodeList<Refal2::CUnit> local_50;
  CHole local_38;
  
  COperationsBuilder::AddMatchLeftParens((COperationsBuilder *)this);
  this_00 = this->hole;
  toNode = (this_00->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last;
  fromNode = ((((this_00->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.first)->
              super_CUnit).field_1.pairedParen)->next;
  local_50.first = (CNodeType *)0x0;
  local_50.last = (CNodeType *)0x0;
  local_50._vptr_CNodeList = (_func_int **)&PTR__CNodeList_0014dcb8;
  if (fromNode != (CNodeType *)0x0) {
    CNodeList<Refal2::CUnit>::Detach((CNodeList<Refal2::CUnit> *)this_00,fromNode,toNode);
    CNodeList<Refal2::CUnit>::Assign(&local_50,fromNode,toNode);
    this_00 = this->hole;
  }
  CNodeList<Refal2::CUnit>::RemoveFirst((CNodeList<Refal2::CUnit> *)this_00);
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  nodeAfter = this->hole;
  CHole::CHole(&local_38,(CUnitList *)&local_50,this->top,this->top + 1);
  CNodeList<Refal2::CHole>::InsertAfter(&this->holes,nodeAfter,&local_38);
  CNodeList<Refal2::CUnit>::~CNodeList((CNodeList<Refal2::CUnit> *)&local_38);
  this->top = this->top + 2;
  CNodeList<Refal2::CUnit>::~CNodeList(&local_50);
  return;
}

Assistant:

void CLeftPartCompiler::matchLeftParens()
{
	COperationsBuilder::AddMatchLeftParens();
	
	CUnitNode* begin = hole->GetFirst();
	CUnitNode* end = hole->GetLast();
	CUnitNode* beginNew = begin->PairedParen()->Next();
	CUnitNode* endNew = 0;

	CUnitList newHole;
	if( beginNew != 0 ) {
		endNew = end;
		hole->Detach( beginNew, endNew );
		newHole.Assign( beginNew, endNew );
	}
	
	hole->RemoveFirst();
	hole->RemoveLast();

	holes.InsertAfter( hole, CHole( newHole, top, top + 1 ) );
	top += 2;
}